

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::SatPreprocessor::Clause::strengthen(Clause *this,Literal p)

{
  uint uVar1;
  bool bVar2;
  uint64 uVar3;
  Literal *in_RDI;
  uint32 end;
  uint32 i;
  uint64 a;
  Literal *in_stack_ffffffffffffffc8;
  uint local_1c;
  ulong local_18;
  
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    bVar2 = Clasp::operator!=(in_RDI,in_stack_ffffffffffffffc8);
    if (!bVar2) break;
    uVar3 = abstractLit((Literal)0x0);
    local_18 = uVar3 | local_18;
    local_1c = local_1c + 1;
  }
  uVar1 = in_RDI[2].rep_;
  for (; local_1c < (uVar1 & 0x3fffffff) - 1; local_1c = local_1c + 1) {
    in_RDI[(ulong)local_1c + 3].rep_ = in_RDI[(ulong)(local_1c + 1) + 3].rep_;
    uVar3 = abstractLit((Literal)0x0);
    local_18 = uVar3 | local_18;
  }
  in_RDI[2].rep_ = in_RDI[2].rep_ & 0xc0000000 | (in_RDI[2].rep_ & 0x3fffffff) - 1 & 0x3fffffff;
  *(ulong *)in_RDI = local_18;
  return;
}

Assistant:

void SatPreprocessor::Clause::strengthen(Literal p) {
	uint64 a = 0;
	uint32 i, end;
	for (i   = 0; lits_[i] != p; ++i) { a |= Clause::abstractLit(lits_[i]); }
	for (end = size_-1; i < end; ++i) { lits_[i] = lits_[i+1]; a |= Clause::abstractLit(lits_[i]); }
	--size_;
	data_.abstr = a;
}